

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCopyInfo.cpp
# Opt level: O1

void __thiscall Js::StringCopyInfoStack::CreateStack(StringCopyInfoStack *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TempArenaAllocatorObject *pTVar4;
  LargeStack<Js::StringCopyInfo> *this_00;
  Type *alloc;
  
  if (this->allocator != (TempArenaAllocatorObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7a,"(!allocator)","!allocator");
    if (!bVar2) goto LAB_00d64323;
    *puVar3 = 0;
  }
  if (this->stack != (LargeStack<Js::StringCopyInfo> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7b,"(!stack)","!stack");
    if (!bVar2) goto LAB_00d64323;
    *puVar3 = 0;
  }
  pTVar4 = ScriptContext::GetTemporaryAllocator(this->scriptContext,L"StringCopyInfoStack");
  this->allocator = pTVar4;
  if (pTVar4 == (TempArenaAllocatorObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7e,"(allocator)","allocator");
    if (!bVar2) {
LAB_00d64323:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  alloc = &this->allocator->allocator;
  this_00 = (LargeStack<Js::StringCopyInfo> *)new<Memory::ArenaAllocator>(0x10,alloc,0x366bee);
  LargeStack<Js::StringCopyInfo>::LargeStack(this_00,alloc);
  this->stack = this_00;
  return;
}

Assistant:

void StringCopyInfoStack::CreateStack()
    {
        Assert(!allocator);
        Assert(!stack);

        allocator = scriptContext->GetTemporaryAllocator(_u("StringCopyInfoStack"));
        Assert(allocator);
        stack = LargeStack<StringCopyInfo>::New(allocator->GetAllocator());
        Assert(stack);
    }